

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void process_playing(DUMB_IT_SIGRENDERER *sigrenderer,IT_PLAYING *playing,float invt2g)

{
  float *pfVar1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  DUMB_IT_SIGDATA *pDVar5;
  DUMB_IT_SIGDATA *pDVar6;
  uchar uVar7;
  int iVar8;
  int iVar9;
  IT_ENVELOPE *envelope;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pDVar5 = sigrenderer->sigdata;
  if (playing->instrument != (IT_INSTRUMENT *)0x0) {
    envelope = &playing->env_instrument->volume_envelope;
    if ((pDVar5->flags & 0x40) == 0) {
      iVar8 = update_it_envelope(playing,envelope,&playing->volume_envelope,1);
      if (iVar8 != 0) {
        uVar4 = playing->flags;
        playing->flags = uVar4 | 4;
        if ((playing->volume_envelope).value == 0) {
          playing->flags = uVar4 | 0xc;
        }
      }
      update_it_envelope(playing,&playing->env_instrument->pan_envelope,&playing->pan_envelope,2);
      update_it_envelope(playing,&playing->env_instrument->pitch_envelope,&playing->pitch_envelope,4
                        );
    }
    else {
      update_xm_envelope(playing,envelope,&playing->volume_envelope);
      update_xm_envelope(playing,&playing->env_instrument->pan_envelope,&playing->pan_envelope);
    }
    if ((playing->flags & 4U) != 0) {
      iVar9 = playing->env_instrument->fadeout;
      piVar2 = &playing->fadeoutcount;
      iVar8 = *piVar2;
      *piVar2 = *piVar2 - iVar9;
      if ((*piVar2 == 0 || SBORROW4(iVar8,iVar9) != *piVar2 < 0) &&
         (playing->fadeoutcount = 0, (pDVar5->flags & 0x40) == 0)) {
        playing->flags = playing->flags | 8;
      }
    }
  }
  pDVar6 = sigrenderer->sigdata;
  iVar8 = sigrenderer->ramp_style;
  iVar9 = apply_pan_envelope(playing);
  if (((sigrenderer->n_channels < 2) || ((pDVar6->flags & 1) == 0)) ||
     (sigrenderer->n_channels == 3 && 0x4000 < iVar9)) {
    playing->float_volume[0] = 1.0;
    fVar10 = 1.0;
  }
  else if (iVar9 < 0x4001) {
    fVar10 = (float)((iVar9 + -0x2000) * pDVar6->pan_separation) * 4.7683716e-07;
    playing->float_volume[0] = 0.5 - fVar10;
    fVar10 = fVar10 + 0.5;
  }
  else {
    playing->float_volume[0] = -0.5;
    fVar10 = 0.5;
  }
  playing->float_volume[1] = fVar10;
  fVar11 = calculate_volume(sigrenderer,playing,1.0);
  fVar12 = fVar11 * (float)*(undefined8 *)playing->float_volume;
  fVar13 = fVar11 * (float)((ulong)*(undefined8 *)playing->float_volume >> 0x20);
  *(ulong *)playing->float_volume = CONCAT44(fVar13,fVar12);
  fVar10 = 4.0;
  if (((0 < iVar8) && (fVar10 = 4.0, playing->declick_stage == '\x02')) &&
     (((playing->ramp_volume[0] == 0.0 && (playing->ramp_volume[1] == 0.0)) || (fVar11 == 0.0)))) {
    fVar10 = 48.0;
  }
  pfVar1 = playing->float_volume;
  if ((iVar8 == 0) || ((iVar8 < 2 && (playing->declick_stage == '\x02')))) {
    if (playing->declick_stage < 3) {
      *(ulong *)playing->ramp_volume = CONCAT44(fVar13,fVar12);
      uVar7 = '\x02';
    }
    else {
      pfVar1[0] = 0.0;
      pfVar1[1] = 0.0;
      playing->ramp_volume[0] = 0.0;
      playing->ramp_volume[1] = 0.0;
      uVar7 = '\x05';
    }
    playing->declick_stage = uVar7;
    playing->ramp_delta[0] = 0.0;
    fVar10 = 0.0;
  }
  else {
    bVar3 = playing->declick_stage;
    if (bVar3 == 1) {
LAB_005b7771:
      fVar10 = 48.0;
    }
    else {
      if (bVar3 == 0) {
        playing->ramp_volume[0] = 0.0;
        playing->ramp_volume[1] = 0.0;
LAB_005b776b:
        playing->declick_stage = bVar3 + 1;
        goto LAB_005b7771;
      }
      if (2 < bVar3) {
        pfVar1[0] = 0.0;
        pfVar1[1] = 0.0;
        if (bVar3 != 3) goto LAB_005b7771;
        goto LAB_005b776b;
      }
    }
    fVar11 = playing->float_volume[1];
    playing->ramp_delta[0] = (playing->float_volume[0] - playing->ramp_volume[0]) * fVar10 * invt2g;
    fVar10 = (fVar11 - playing->ramp_volume[1]) * fVar10 * invt2g;
  }
  playing->ramp_delta[1] = fVar10;
  if ((pDVar5->flags & 0x40) == 0) {
    iVar9 = (uint)playing->sample->vibrato_rate + playing->sample_vibrato_depth;
    playing->sample_vibrato_depth = iVar9;
    iVar8 = (uint)playing->sample->vibrato_depth << 8;
    if (iVar9 < iVar8) {
      iVar8 = iVar9;
    }
  }
  else {
    if ((int)(uint)playing->sample->vibrato_rate <= playing->sample_vibrato_depth)
    goto LAB_005b77ee;
    iVar8 = playing->sample_vibrato_depth + 1;
  }
  playing->sample_vibrato_depth = iVar8;
LAB_005b77ee:
  playing->sample_vibrato_time = playing->sample_vibrato_time + playing->sample->vibrato_speed;
  return;
}

Assistant:

static void process_playing(DUMB_IT_SIGRENDERER *sigrenderer, IT_PLAYING *playing, float invt2g)
{
	DUMB_IT_SIGDATA * sigdata = sigrenderer->sigdata;

	if (playing->instrument) {
		if (sigdata->flags & IT_WAS_AN_XM)
			update_xm_envelopes(playing);
		else
			update_it_envelopes(playing);
		update_fadeout(sigdata, playing);
	}

	playing_volume_setup(sigrenderer, playing, invt2g);

	if (sigdata->flags & IT_WAS_AN_XM) {
		/* 'depth' is used to store the tick number for XM files. */
		if (playing->sample_vibrato_depth < playing->sample->vibrato_rate)
			playing->sample_vibrato_depth++;
	} else {
		playing->sample_vibrato_depth += playing->sample->vibrato_rate;
		if (playing->sample_vibrato_depth > playing->sample->vibrato_depth << 8)
			playing->sample_vibrato_depth = playing->sample->vibrato_depth << 8;
	}

	playing->sample_vibrato_time += playing->sample->vibrato_speed;
}